

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_add_many(REF_NODE ref_node,REF_INT n,REF_GLOB *global_orig)

{
  REF_STATUS RVar1;
  uint uVar2;
  int iVar3;
  REF_GLOB *original;
  REF_INT *sorted_index;
  ulong uVar4;
  undefined8 uVar5;
  ulong uVar6;
  uint n_00;
  char *pcVar7;
  REF_INT local;
  REF_INT local_34;
  
  if (n < 0) {
    pcVar7 = "malloc global of REF_GLOB negative";
    uVar5 = 0x179;
LAB_0019d1f2:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar5,
           "ref_node_add_many",pcVar7);
    RVar1 = 1;
  }
  else {
    original = (REF_GLOB *)malloc((ulong)(uint)n * 8);
    if (original == (REF_GLOB *)0x0) {
      pcVar7 = "malloc global of REF_GLOB NULL";
      uVar5 = 0x179;
    }
    else {
      if (n == 0) {
        n_00 = 0;
      }
      else {
        uVar6 = 0;
        n_00 = 0;
        do {
          RVar1 = ref_node_local(ref_node,global_orig[uVar6],&local_34);
          if (RVar1 == 5) {
            original[(int)n_00] = global_orig[uVar6];
            n_00 = n_00 + 1;
          }
          uVar6 = uVar6 + 1;
        } while ((uint)n != uVar6);
        if ((int)n_00 < 0) {
          pcVar7 = "malloc sorted of REF_INT negative";
          uVar5 = 0x186;
          goto LAB_0019d1f2;
        }
      }
      uVar6 = (ulong)n_00;
      sorted_index = (REF_INT *)malloc(uVar6 * 4);
      if (sorted_index != (REF_INT *)0x0) {
        uVar2 = ref_sort_heap_glob(n_00,original,sorted_index);
        if (uVar2 == 0) {
          if (1 < n_00) {
            iVar3 = 0;
            uVar4 = 1;
            do {
              if (original[sorted_index[uVar4]] == original[sorted_index[iVar3]]) {
                original[sorted_index[uVar4]] = -1;
              }
              else {
                iVar3 = (int)uVar4;
              }
              uVar4 = uVar4 + 1;
            } while (uVar6 != uVar4);
          }
          if (uVar6 != 0) {
            uVar4 = 0;
            do {
              if ((original[uVar4] != -1) &&
                 (uVar2 = ref_node_add_core(ref_node,original[uVar4],&local_34), uVar2 != 0)) {
                pcVar7 = "add core";
                uVar5 = 0x197;
                goto LAB_0019d37f;
              }
              uVar4 = uVar4 + 1;
            } while (uVar6 != uVar4);
          }
          uVar2 = ref_node_rebuild_sorted_global(ref_node);
          if (uVar2 == 0) {
            free(sorted_index);
            free(original);
            return 0;
          }
          pcVar7 = "rebuild globals";
          uVar5 = 0x19a;
        }
        else {
          pcVar7 = "heap";
          uVar5 = 0x188;
        }
LAB_0019d37f:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               uVar5,"ref_node_add_many",(ulong)uVar2,pcVar7);
        return uVar2;
      }
      pcVar7 = "malloc sorted of REF_INT NULL";
      uVar5 = 0x186;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar5,
           "ref_node_add_many",pcVar7);
    RVar1 = 2;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_node_add_many(REF_NODE ref_node, REF_INT n,
                                     REF_GLOB *global_orig) {
  REF_STATUS status;
  REF_INT i, j, local, nadd;

  REF_GLOB *global;
  REF_INT *sorted;

  /* copy, removing existing nodes from list */

  ref_malloc(global, n, REF_GLOB);

  nadd = 0;
  for (i = 0; i < n; i++) {
    status = ref_node_local(ref_node, global_orig[i], &local);
    if (REF_NOT_FOUND == status) {
      global[nadd] = global_orig[i];
      nadd++;
    }
  }

  /* remove duplicates from list so core add can be used with existing check */

  ref_malloc(sorted, nadd, REF_INT);

  RSS(ref_sort_heap_glob(nadd, global, sorted), "heap");

  j = 0;
  for (i = 1; i < nadd; i++) {
    if (global[sorted[i]] != global[sorted[j]]) {
      j = i;
      continue;
    }
    global[sorted[i]] = REF_EMPTY;
  }

  /* add remaining via core */

  for (i = 0; i < nadd; i++)
    if (REF_EMPTY != global[i]) {
      RSS(ref_node_add_core(ref_node, global[i], &local), "add core");
    }

  RSS(ref_node_rebuild_sorted_global(ref_node), "rebuild globals");

  ref_free(sorted);
  ref_free(global);

  return REF_SUCCESS;
}